

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::JitCompilerX86(JitCompilerX86 *this)

{
  int iVar1;
  ProcessorInfo PVar2;
  uint uVar3;
  uint uVar4;
  char *__s1;
  void *pvVar5;
  long in_RDI;
  uint32_t stepping;
  uint32_t model;
  ProcessorInfo info;
  Cpu cpu;
  bool local_56;
  bool local_55;
  Cpu *in_stack_ffffffffffffffb0;
  Cpu local_20;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1433a0);
  Cpu::Cpu(in_stack_ffffffffffffffb0);
  __s1 = Cpu::manufacturer(&local_20);
  iVar1 = strcmp(__s1,"GenuineIntel");
  if ((iVar1 == 0) && (PVar2 = Cpu::processorInfo(&local_20), ((uint)PVar2 >> 8 & 0xf) == 6)) {
    uVar3 = (uint)PVar2 >> 4 & 0xf | ((uint)PVar2 >> 0x10 & 0xf) << 4;
    uVar4 = (uint)PVar2 & 0xf;
    if (((((uVar3 != 0x4e) || (local_55 = true, uVar4 != 3)) &&
         ((uVar3 != 0x55 || (local_55 = true, uVar4 != 4)))) &&
        (((uVar3 != 0x5e || (local_55 = true, uVar4 != 3)) &&
         ((((uVar3 != 0x8e || (uVar4 < 9)) || (local_55 = true, 0xc < uVar4)) &&
          (((uVar3 != 0x9e || (uVar4 < 9)) || (local_55 = true, 0xd < uVar4)))))))) &&
       ((uVar3 != 0xa6 || (local_55 = true, uVar4 != 0)))) {
      local_56 = uVar3 == 0xae && uVar4 == 10;
      local_55 = local_56;
    }
    BranchesWithin32B = local_55;
  }
  pvVar5 = allocMemoryPages((size_t)__s1);
  *(void **)(in_RDI + 0x38) = pvVar5;
  memcpy(*(void **)(in_RDI + 0x38),codePrologue,(long)prologueSize);
  memcpy((void *)(*(long *)(in_RDI + 0x38) + (long)epilogueOffset),codeEpilogue,(long)epilogueSize);
  return;
}

Assistant:

JitCompilerX86::JitCompilerX86() {
		// CPU-specific tweaks
		Cpu cpu;
		if (strcmp(cpu.manufacturer(), "GenuineIntel") == 0) {
			Cpu::ProcessorInfo info = cpu.processorInfo();

			// Intel JCC erratum mitigation
			if (info.family == 6) {
				const uint32_t model = info.model | (info.ext_model << 4);
				const uint32_t stepping = info.stepping;

				// Affected CPU models and stepping numbers are taken from https://www.intel.com/content/dam/support/us/en/documents/processors/mitigations-jump-conditional-code-erratum.pdf
				BranchesWithin32B =
					((model == 0x4E) && (stepping == 0x3)) ||
					((model == 0x55) && (stepping == 0x4)) ||
					((model == 0x5E) && (stepping == 0x3)) ||
					((model == 0x8E) && (stepping >= 0x9) && (stepping <= 0xC)) ||
					((model == 0x9E) && (stepping >= 0x9) && (stepping <= 0xD)) ||
					((model == 0xA6) && (stepping == 0x0)) ||
					((model == 0xAE) && (stepping == 0xA));
			}
		}

		code = (uint8_t*)allocMemoryPages(CodeSize);
		memcpy(code, codePrologue, prologueSize);
		memcpy(code + epilogueOffset, codeEpilogue, epilogueSize);
	}